

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O2

void __thiscall
KokkosTools::ChromeTracing::State::begin_frame(State *this,char *name,StackKind kind)

{
  string name_str;
  allocator<char> local_3d;
  StackKind local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_3c = kind;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_3d);
  std::
  vector<KokkosTools::ChromeTracing::StackNode,std::allocator<KokkosTools::ChromeTracing::StackNode>>
  ::
  emplace_back<std::__cxx11::string,KokkosTools::ChromeTracing::StackKind&,int&,KokkosTools::ChromeTracing::Now&>
            ((vector<KokkosTools::ChromeTracing::StackNode,std::allocator<KokkosTools::ChromeTracing::StackNode>>
              *)&this->current_stack,&local_38,&local_3c,&this->my_mpi_rank,&this->my_base_time);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void begin_frame(const char *name, StackKind kind) {
    std::string name_str(name);
    current_stack.emplace_back(std::move(name_str), kind, my_mpi_rank,
                               my_base_time);
  }